

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_formatter.h
# Opt level: O1

void ST::format_type(format_spec *format,format_writer *output,wchar_t *wtext)

{
  undefined1 uVar1;
  char *__dest;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  char_buffer utf8;
  char local_58 [8];
  char acStack_50 [8];
  string local_48;
  
  if (wtext == (wchar_t *)0x0) {
    return;
  }
  string::from_wchar(&local_48,wtext,0xffffffffffffffff,check_validity);
  if (local_48.m_buffer.m_size < 0x10) {
    __dest = local_58;
    local_58[0] = local_48.m_buffer.m_data[0];
    local_58[1] = local_48.m_buffer.m_data[1];
    local_58[2] = local_48.m_buffer.m_data[2];
    local_58[3] = local_48.m_buffer.m_data[3];
    local_58[4] = local_48.m_buffer.m_data[4];
    local_58[5] = local_48.m_buffer.m_data[5];
    local_58[6] = local_48.m_buffer.m_data[6];
    local_58[7] = local_48.m_buffer.m_data[7];
    acStack_50[0] = local_48.m_buffer.m_data[8];
    acStack_50[1] = local_48.m_buffer.m_data[9];
    acStack_50[2] = local_48.m_buffer.m_data[10];
    acStack_50[3] = local_48.m_buffer.m_data[0xb];
    acStack_50[4] = local_48.m_buffer.m_data[0xc];
    acStack_50[5] = local_48.m_buffer.m_data[0xd];
    acStack_50[6] = local_48.m_buffer.m_data[0xe];
    acStack_50[7] = local_48.m_buffer.m_data[0xf];
  }
  else {
    __dest = (char *)operator_new__(local_48.m_buffer.m_size + 1);
    memcpy(__dest,local_48.m_buffer.m_chars,local_48.m_buffer.m_size);
    __dest[local_48.m_buffer.m_size] = '\0';
    if (local_48.m_buffer.m_chars != (char *)0x0) {
      operator_delete__(local_48.m_buffer.m_chars);
    }
  }
  uVar1 = format->pad;
  cVar3 = ' ';
  if (uVar1 != '\0') {
    cVar3 = uVar1;
  }
  uVar2 = (ulong)format->precision;
  uVar4 = local_48.m_buffer.m_size;
  if (uVar2 < local_48.m_buffer.m_size) {
    uVar4 = uVar2;
  }
  if ((long)uVar2 < 0) {
    uVar4 = local_48.m_buffer.m_size;
  }
  if ((int)uVar4 < format->minimum_length) {
    if (format->alignment != align_right) {
      (*output->_vptr_format_writer[2])(output,__dest,uVar4);
      (*output->_vptr_format_writer[3])
                (output,(ulong)(uint)(int)cVar3,(long)format->minimum_length - uVar4);
      goto LAB_001ecd39;
    }
    (*output->_vptr_format_writer[3])
              (output,(ulong)(uint)(int)cVar3,(long)format->minimum_length - uVar4);
  }
  (*output->_vptr_format_writer[2])(output,__dest,uVar4);
LAB_001ecd39:
  if ((0xf < local_48.m_buffer.m_size) && (__dest != (char *)0x0)) {
    operator_delete__(__dest);
  }
  return;
}

Assistant:

inline void format_type(const ST::format_spec &format, ST::format_writer &output,
                            const wchar_t *wtext)
    {
        if (wtext) {
            ST::char_buffer utf8 = ST::string::from_wchar(wtext).to_utf8();
            ST::format_string(format, output, utf8.data(), utf8.size());
        }
    }